

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void xla::MoveToList(Rep *r,vector<int,_std::allocator<int>_> *src,
                    vector<int,_std::allocator<int>_> *dst)

{
  pointer piVar1;
  pointer pNVar2;
  size_t i;
  ulong uVar3;
  int32_t w;
  int local_2c;
  
  for (uVar3 = 0;
      piVar1 = (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start,
      uVar3 < (ulong)((long)(src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 1) {
    local_2c = piVar1[uVar3];
    pNVar2 = (r->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar1[uVar3] = pNVar2[local_2c].rank;
    pNVar2[local_2c].visited = false;
    std::vector<int,_std::allocator<int>_>::push_back(dst,&local_2c);
  }
  return;
}

Assistant:

static void MoveToList(GraphCycles::Rep* r, std::vector<int32_t>* src,
                       std::vector<int32_t>* dst) {
  for (size_t i = 0; i < src->size(); i++) {
    int32_t w = (*src)[i];
    (*src)[i] = r->nodes_[w].rank;  // Replace src entry with its rank
    r->nodes_[w].visited = false;   // Prepare for future DFS calls
    dst->push_back(w);
  }
}